

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O3

void Open_JTalk_refresh(Open_JTalk *open_jtalk)

{
  int iVar1;
  
  if (open_jtalk != (Open_JTalk *)0x0) {
    iVar1 = JPCommon_get_label_size(&open_jtalk->jpcommon);
    if (2 < iVar1) {
      HTS_Engine_refresh(&open_jtalk->engine);
    }
    JPCommon_refresh(&open_jtalk->jpcommon);
    NJD_refresh(&open_jtalk->njd);
    Mecab_refresh(&open_jtalk->mecab);
    return;
  }
  return;
}

Assistant:

void Open_JTalk_refresh(Open_JTalk *open_jtalk)
{
	if (open_jtalk == NULL)
	{
		return;
	}
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		HTS_Engine_refresh(&open_jtalk->engine);
	}
	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);
	Mecab_refresh(&open_jtalk->mecab);
}